

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

void __thiscall EOPlus::Context::DoActions(Context *this)

{
  State *pSVar1;
  _Elt_pointer pAVar2;
  char cVar3;
  uint uVar4;
  runtime_error *this_00;
  int iVar5;
  _Elt_pointer pAVar6;
  _Elt_pointer pAVar7;
  _Map_pointer ppAVar8;
  Action action;
  Action local_1b8;
  
  pSVar1 = this->state;
  if (pSVar1 == (State *)0x0) {
    if (this->finished == false) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"No state selected");
      goto LAB_00139700;
    }
  }
  else {
    iVar5 = recursive_depth + 1;
    if (100 < iVar5) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Quest action recursion too deep");
LAB_00139700:
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pAVar7 = (pSVar1->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>.
             _M_impl.super__Deque_impl_data._M_start._M_cur;
    pAVar2 = (pSVar1->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    recursive_depth = iVar5;
    if (pAVar7 != pAVar2) {
      pAVar6 = (pSVar1->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>.
               _M_impl.super__Deque_impl_data._M_start._M_last;
      ppAVar8 = (pSVar1->actions).super__Deque_base<EOPlus::Action,_std::allocator<EOPlus::Action>_>
                ._M_impl.super__Deque_impl_data._M_start._M_node;
      uVar4 = 0;
      do {
        Action::Action(&local_1b8,pAVar7);
        if (((local_1b8.cond & ~If) != Else) || ((uVar4 & 1) == 0)) {
          if ((local_1b8.cond & ~Else) == If) {
            uVar4 = (*this->_vptr_Context[2])(this,&local_1b8.cond_expr);
            if ((char)uVar4 == '\0') goto LAB_00139605;
            iVar5 = (*this->_vptr_Context[1])(this,&local_1b8);
            cVar3 = (char)iVar5;
          }
          else {
            iVar5 = (*this->_vptr_Context[1])(this,&local_1b8);
            cVar3 = (char)iVar5;
          }
          if (cVar3 != '\0') {
            recursive_depth = recursive_depth + -1;
          }
        }
LAB_00139605:
        std::deque<util::variant,_std::allocator<util::variant>_>::~deque(&local_1b8.expr.args);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8.expr.function._M_dataplus._M_p != &local_1b8.expr.function.field_2) {
          operator_delete(local_1b8.expr.function._M_dataplus._M_p,
                          local_1b8.expr.function.field_2._M_allocated_capacity + 1);
        }
        std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque(&local_1b8.expr.scopes);
        std::deque<util::variant,_std::allocator<util::variant>_>::~deque(&local_1b8.cond_expr.args)
        ;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1b8.cond_expr.function._M_dataplus._M_p !=
            &local_1b8.cond_expr.function.field_2) {
          operator_delete(local_1b8.cond_expr.function._M_dataplus._M_p,
                          local_1b8.cond_expr.function.field_2._M_allocated_capacity + 1);
        }
        std::deque<EOPlus::Scope,_std::allocator<EOPlus::Scope>_>::~deque
                  (&local_1b8.cond_expr.scopes);
        pAVar7 = pAVar7 + 1;
        if (pAVar7 == pAVar6) {
          pAVar7 = ppAVar8[1];
          ppAVar8 = ppAVar8 + 1;
          pAVar6 = pAVar7 + 1;
        }
      } while (pAVar7 != pAVar2);
    }
    recursive_depth = recursive_depth + -1;
    CheckRules(this);
  }
  return;
}

Assistant:

void Context::DoActions()
	{
		if (!this->state)
		{
			if (this->finished)
				return;
			else
				throw std::runtime_error("No state selected");
		}

		if (++recursive_depth > max_recursion)
		{
			--recursive_depth;
			throw std::runtime_error("Quest action recursion too deep");
		}

		try
		{
			auto do_action = [&](const EOPlus::Action& action)
			{
				if (this->DoAction(action))
				{
					// *this may not be valid here
					--recursive_depth;
					return;
				}
			};

			bool last_cond = false;

			UTIL_FOREACH(this->state->actions, action)
			{
				if (action.cond == EOPlus::Action::ElseIf || action.cond == EOPlus::Action::Else)
				{
					if (last_cond)
						continue;
				}

				if (action.cond == EOPlus::Action::If || action.cond == EOPlus::Action::ElseIf)
				{
					last_cond = this->CheckRule(action.cond_expr);

					if (last_cond)
						do_action(action);
				}
				else
				{
					do_action(action);
				}
			}
		}
		catch (...)
		{
			--recursive_depth;
			throw;
		}

		--recursive_depth;
		this->CheckRules();
	}